

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::get(ParmParse *this,char *name,string *ptr,int ival)

{
  Table *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *name_00;
  allocator local_61;
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  ParmParse *in_stack_ffffffffffffffc0;
  
  name_00 = (string *)in_RDI[2].field_2._M_allocated_capacity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,(char *)in_RSI,&local_61);
  prefixedName(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (anonymous_namespace)::(anonymous_namespace)::sgetval<std::__cxx11::string>
            (in_RSI,name_00,in_RDI,0,0xf0fdf0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void
ParmParse::get (const char* name,
                std::string&    ptr,
                int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival, LAST);
}